

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubD_ComponentIdTypeAndTag::CompareTypeAndIdAndTag
              (ON_SubD_ComponentIdTypeAndTag *lhs,ON_SubD_ComponentIdTypeAndTag *rhs)

{
  byte bVar1;
  byte bVar2;
  uchar rhs_tag;
  uchar lhs_tag;
  int rc;
  ON_SubD_ComponentIdTypeAndTag *rhs_local;
  ON_SubD_ComponentIdTypeAndTag *lhs_local;
  
  lhs_local._4_4_ = CompareTypeAndId(lhs,rhs);
  if (lhs_local._4_4_ == 0) {
    if (lhs == (ON_SubD_ComponentIdTypeAndTag *)0x0) {
      lhs_local._4_4_ = 1;
    }
    else if (rhs == (ON_SubD_ComponentIdTypeAndTag *)0x0) {
      lhs_local._4_4_ = -1;
    }
    else {
      bVar1 = Internal_Tag(lhs);
      bVar2 = Internal_Tag(rhs);
      if (bVar1 < bVar2) {
        lhs_local._4_4_ = -1;
      }
      else if (bVar2 < bVar1) {
        lhs_local._4_4_ = 1;
      }
      else {
        lhs_local._4_4_ = 0;
      }
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubD_ComponentIdTypeAndTag::CompareTypeAndIdAndTag(const ON_SubD_ComponentIdTypeAndTag* lhs, const ON_SubD_ComponentIdTypeAndTag* rhs)
{
  int rc = ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId(lhs, rhs);
  if (0 != rc)
    return rc;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  const unsigned char lhs_tag = lhs->Internal_Tag();
  const unsigned char rhs_tag = rhs->Internal_Tag();
  if (lhs_tag < rhs_tag)
    return -1;
  if (lhs_tag > rhs_tag)
    return 1;
  return 0;
}